

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O3

void __thiscall tonk::ReceiverStatistics::Compress(ReceiverStatistics *this,uint8_t *buffer)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint8_t uVar3;
  undefined2 uVar4;
  uint uVar5;
  
  if (0.0 < this->LossRate) {
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x43800000),0),ZEXT416((uint)this->LossRate),
                             ZEXT416(0x3f000000));
    uVar5 = (uint)auVar1._0_4_;
    if (0 < (int)uVar5) {
      if (0xfe < uVar5) {
        uVar5 = 0xff;
      }
      uVar3 = (uint8_t)uVar5;
      goto LAB_001342e0;
    }
  }
  uVar3 = '\0';
LAB_001342e0:
  *buffer = uVar3;
  uVar5 = this->GoodputBPS;
  if (uVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar2 = (0x15U - LZCOUNT(uVar5)) * 0x800 | uVar5 >> (0x15U - LZCOUNT(uVar5) & 0x1f);
    if (uVar5 < 0x800) {
      uVar2 = uVar5;
    }
    uVar4 = (undefined2)uVar2;
  }
  *(undefined2 *)(buffer + 1) = uVar4;
  uVar5 = this->TripUsec;
  if (uVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar2 = (0x15U - LZCOUNT(uVar5)) * 0x800 | uVar5 >> (0x15U - LZCOUNT(uVar5) & 0x1f);
    if (uVar5 < 0x800) {
      uVar2 = uVar5;
    }
    uVar4 = (undefined2)uVar2;
  }
  *(undefined2 *)(buffer + 3) = uVar4;
  return;
}

Assistant:

void ReceiverStatistics::Compress(uint8_t* buffer) const
{
    uint8_t lossRateByte = 0;
    if (LossRate > 0.f)
    {
        const int lossRateInt = static_cast<int>(LossRate * 256.f + 0.5f);
        if (lossRateInt > 0)
        {
            if (lossRateInt >= 255) {
                lossRateByte = 255;
            }
            else {
                lossRateByte = static_cast<uint8_t>(lossRateInt);
            }
        }
    }
    buffer[0] = lossRateByte;

    siamese::WriteU16_LE(buffer + 1, FixedPointCompress32to16(GoodputBPS));
    siamese::WriteU16_LE(buffer + 3, FixedPointCompress32to16(TripUsec));
}